

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkobj.c
# Opt level: O1

void obj_extract_self(obj *obj)

{
  obj **head_ptr;
  long lVar1;
  
  switch(obj->where) {
  case '\0':
    return;
  case '\x01':
    remove_object(obj);
    return;
  case '\x02':
    extract_nobj(obj,&((obj->v).v_nexthere)->cobj);
    container_weight((obj->v).v_nexthere);
    return;
  case '\x03':
    freeinv(obj);
    return;
  case '\x04':
    head_ptr = &((obj->v).v_ocarry)->minvent;
    goto LAB_001e145f;
  case '\x05':
    lVar1 = 0xb808;
    break;
  case '\x06':
    lVar1 = 0xb810;
    break;
  case '\a':
    head_ptr = &magic_chest_objs;
    goto LAB_001e145f;
  default:
    panic("obj_extract_self");
  }
  head_ptr = (obj **)(obj->olev->levname + lVar1);
LAB_001e145f:
  extract_nobj(obj,head_ptr);
  return;
}

Assistant:

void obj_extract_self(struct obj *obj)
{
    switch (obj->where) {
	case OBJ_FREE:
	    break;
	case OBJ_FLOOR:
	    remove_object(obj);
	    break;
	case OBJ_CONTAINED:
	    extract_nobj(obj, &obj->ocontainer->cobj);
	    container_weight(obj->ocontainer);
	    break;
	case OBJ_INVENT:
	    freeinv(obj);
	    break;
	case OBJ_MINVENT:
	    extract_nobj(obj, &obj->ocarry->minvent);
	    break;
	case OBJ_BURIED:
	    extract_nobj(obj, &obj->olev->buriedobjlist);
	    break;
	case OBJ_ONBILL:
	    extract_nobj(obj, &obj->olev->billobjs);
	    break;
	case OBJ_MAGIC_CHEST:
	    extract_nobj(obj, &magic_chest_objs);
	    break;
	default:
	    panic("obj_extract_self");
	    break;
    }
}